

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrase.cpp
# Opt level: O3

bool jhu::thrax::isConsistent(Alignment *a,SpanPair sp)

{
  Point PVar1;
  pointer pPVar2;
  pointer pPVar3;
  pointer pPVar4;
  pointer pPVar5;
  ulong uVar6;
  Span SVar7;
  long lVar9;
  short sVar10;
  int iVar12;
  int iVar13;
  int iVar8;
  int iVar11;
  
  pPVar4 = (a->super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pPVar2 = (a->super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar6 = (long)pPVar2 - (long)pPVar4;
  SVar7 = sp.src;
  iVar8 = (int)SVar7 >> 0x10;
  sVar10 = sp.tgt.start;
  iVar11 = (int)sp.tgt >> 0x10;
  if (0 < (long)uVar6 >> 4) {
    iVar12 = (int)SVar7 * 0x10000;
    iVar13 = (int)sVar10;
    pPVar3 = (pointer)((long)&pPVar4->src + (uVar6 & 0xfffffffffffffff0));
    lVar9 = ((long)uVar6 >> 4) + 1;
    pPVar5 = pPVar4 + 2;
    do {
      PVar1 = pPVar5[-2];
      if (((int)PVar1 >> 0x10 < iVar11 && iVar13 <= (int)PVar1 >> 0x10) !=
          (PVar1.src < iVar8 && iVar12 <= (int)PVar1 * 0x10000)) {
        pPVar5 = pPVar5 + -2;
        goto LAB_00109ee0;
      }
      PVar1 = pPVar5[-1];
      if (((int)PVar1 >> 0x10 < iVar11 && iVar13 <= (int)PVar1 >> 0x10) !=
          (PVar1.src < iVar8 && iVar12 <= (int)PVar1 * 0x10000)) {
        pPVar5 = pPVar5 + -1;
        goto LAB_00109ee0;
      }
      PVar1 = *pPVar5;
      if (((int)PVar1 >> 0x10 < iVar11 && iVar13 <= (int)PVar1 >> 0x10) !=
          (PVar1.src < iVar8 && iVar12 <= (int)PVar1 * 0x10000)) goto LAB_00109ee0;
      PVar1 = pPVar5[1];
      if (((int)PVar1 >> 0x10 < iVar11 && iVar13 <= (int)PVar1 >> 0x10) !=
          (PVar1.src < iVar8 && iVar12 <= (int)PVar1 * 0x10000)) {
        pPVar5 = pPVar5 + 1;
        goto LAB_00109ee0;
      }
      lVar9 = lVar9 + -1;
      pPVar5 = pPVar5 + 4;
    } while (1 < lVar9);
    uVar6 = (long)pPVar2 - (long)pPVar3;
    pPVar4 = pPVar3;
  }
  lVar9 = (long)uVar6 >> 2;
  if (lVar9 == 3) {
    PVar1 = *pPVar4;
    iVar12 = (int)SVar7 * 0x10000;
    pPVar5 = pPVar4;
    if (((int)PVar1 >> 0x10 < iVar11 && (int)sVar10 <= (int)PVar1 >> 0x10) !=
        (PVar1.src < iVar8 && iVar12 <= (int)PVar1 * 0x10000)) goto LAB_00109ee0;
    pPVar4 = pPVar4 + 1;
LAB_00109e60:
    PVar1 = *pPVar4;
    pPVar5 = pPVar4;
    if (((int)PVar1 >> 0x10 < iVar11 && (int)sVar10 <= (int)PVar1 >> 0x10) !=
        (PVar1.src < iVar8 && iVar12 <= (int)PVar1 * 0x10000)) goto LAB_00109ee0;
    pPVar4 = pPVar4 + 1;
  }
  else {
    if (lVar9 == 2) {
      iVar12 = (int)SVar7 << 0x10;
      goto LAB_00109e60;
    }
    pPVar5 = pPVar2;
    if (lVar9 != 1) goto LAB_00109ee0;
    iVar12 = (int)SVar7 << 0x10;
  }
  PVar1 = *pPVar4;
  pPVar5 = pPVar4;
  if (((int)PVar1 >> 0x10 < iVar11 && (int)sVar10 <= (int)PVar1 >> 0x10) ==
      (PVar1.src < iVar8 && iVar12 <= (int)PVar1 * 0x10000)) {
    pPVar5 = pPVar2;
  }
LAB_00109ee0:
  return pPVar5 == pPVar2;
}

Assistant:

bool isConsistent(const Alignment& a, SpanPair sp) {
  constexpr auto contains = [](IndexType p, Span s) {
    return p >= s.start && p < s.end;
  };
  return std::none_of(
      a.begin(),
      a.end(),
      [contains,sp](Point p) {
        return contains(p.src, sp.src) ^ contains(p.tgt, sp.tgt);
      });
}